

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLin>
               (GetterXsYs<long_long> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  ImVec2 IVar2;
  ImPlotPlot *pIVar3;
  float fVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this;
  long lVar8;
  int iVar9;
  int iVar10;
  ImPlotContext *gp;
  double dVar11;
  float fVar12;
  float fVar13;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_90;
  undefined1 local_88 [16];
  ImDrawList *local_70;
  ImVec2 local_68;
  TransformerLogLin *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar3 = GImPlot->CurrentPlot;
  local_70 = DrawList;
  if (((pIVar3->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar9 = getter->Count;
    local_48 = iVar9 + -1;
    local_40 = line_weight * 0.5;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    local_88._8_4_ = in_XMM1_Dc;
    local_88._0_8_ = (double)*(long *)((long)getter->Ys + lVar8);
    local_88._12_4_ = in_XMM1_Dd;
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar11 = log10((double)*(long *)((long)getter->Xs + lVar8) / (pIVar3->XAxis).Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar5 = (pIVar3->XAxis).Range.Min;
    iVar9 = transformer->YAxis;
    IVar2 = pIVar6->PixelRange[iVar9].Min;
    local_3c.x = (float)(pIVar6->Mx *
                         (((double)(float)(dVar11 / pIVar6->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar5) + dVar5) - dVar5) + (double)IVar2.x);
    local_3c.y = (float)(pIVar6->My[iVar9] *
                         ((double)local_88._0_8_ - pIVar3->YAxis[iVar9].Range.Min) + (double)IVar2.y
                        );
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLin>>
              ((StairsRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLin> *)local_58,
               local_70,&pIVar3->PlotRect);
  }
  else {
    iVar9 = getter->Count;
    lVar8 = (long)((getter->Offset % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
    local_88._8_4_ = in_XMM1_Dc;
    local_88._0_8_ = (double)*(long *)((long)getter->Ys + lVar8);
    local_88._12_4_ = in_XMM1_Dd;
    dVar11 = log10((double)*(long *)((long)getter->Xs + lVar8) / (pIVar3->XAxis).Range.Min);
    pIVar3 = pIVar6->CurrentPlot;
    dVar5 = (pIVar3->XAxis).Range.Min;
    iVar9 = transformer->YAxis;
    IVar2 = pIVar6->PixelRange[iVar9].Min;
    local_58._0_4_ =
         (undefined4)
         (pIVar6->Mx *
          (((double)(float)(dVar11 / pIVar6->LogDenX) * ((pIVar3->XAxis).Range.Max - dVar5) + dVar5)
          - dVar5) + (double)IVar2.x);
    local_58._4_4_ =
         (undefined4)
         (pIVar6->My[iVar9] * ((double)local_88._0_8_ - pIVar3->YAxis[iVar9].Range.Min) +
         (double)IVar2.y);
    iVar9 = getter->Count;
    if (1 < iVar9) {
      iVar10 = 1;
      local_60 = transformer;
      do {
        pIVar7 = GImPlot;
        lVar8 = (long)(((getter->Offset + iVar10) % iVar9 + iVar9) % iVar9) * (long)getter->Stride;
        local_88._8_8_ = 0;
        local_88._0_8_ = (double)*(long *)((long)getter->Ys + lVar8);
        dVar11 = log10((double)*(long *)((long)getter->Xs + lVar8) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        this = local_70;
        pIVar3 = pIVar7->CurrentPlot;
        dVar5 = (pIVar3->XAxis).Range.Min;
        iVar9 = transformer->YAxis;
        IVar2 = pIVar7->PixelRange[iVar9].Min;
        fVar12 = (float)(pIVar7->Mx *
                         (((double)(float)(dVar11 / pIVar7->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar5) + dVar5) - dVar5) + (double)IVar2.x);
        fVar13 = (float)(pIVar7->My[iVar9] *
                         ((double)local_88._0_8_ - pIVar3->YAxis[iVar9].Range.Min) + (double)IVar2.y
                        );
        local_68.y = fVar13;
        local_68.x = fVar12;
        pIVar3 = pIVar6->CurrentPlot;
        fVar4 = (float)local_58._4_4_;
        if (fVar13 <= (float)local_58._4_4_) {
          fVar4 = fVar13;
        }
        if ((fVar4 < (pIVar3->PlotRect).Max.y) &&
           (fVar4 = (float)(~-(uint)(fVar13 <= (float)local_58._4_4_) & (uint)fVar13 |
                           -(uint)(fVar13 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar4 && fVar4 != *pfVar1)) {
          fVar4 = (float)local_58._0_4_;
          if (fVar12 <= (float)local_58._0_4_) {
            fVar4 = fVar12;
          }
          if ((fVar4 < (pIVar3->PlotRect).Max.x) &&
             (fVar4 = (float)(-(uint)(fVar12 <= (float)local_58._0_4_) & local_58._0_4_ |
                             ~-(uint)(fVar12 <= (float)local_58._0_4_) & (uint)fVar12),
             (pIVar3->PlotRect).Min.x <= fVar4 && fVar4 != (pIVar3->PlotRect).Min.x)) {
            local_90.y = (float)local_58._4_4_;
            local_90.x = fVar12;
            ImDrawList::AddLine(local_70,(ImVec2 *)local_58,&local_90,col,line_weight);
            transformer = local_60;
            ImDrawList::AddLine(this,&local_90,&local_68,col,line_weight);
          }
        }
        iVar10 = iVar10 + 1;
        iVar9 = getter->Count;
        local_58 = (undefined1  [8])local_68;
      } while (iVar10 < iVar9);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}